

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_reflect.cpp
# Opt level: O0

void __thiscall simple_json::Stream::begin_json_array(Stream *this)

{
  bool bVar1;
  reference pvVar2;
  bool local_15;
  Type local_14;
  Stream *local_10;
  Stream *this_local;
  
  local_10 = this;
  bVar1 = std::
          stack<std::pair<simple_json::Type,_bool>,_std::deque<std::pair<simple_json::Type,_bool>,_std::allocator<std::pair<simple_json::Type,_bool>_>_>_>
          ::empty(&this->stack);
  if (!bVar1) {
    pvVar2 = std::
             stack<std::pair<simple_json::Type,_bool>,_std::deque<std::pair<simple_json::Type,_bool>,_std::allocator<std::pair<simple_json::Type,_bool>_>_>_>
             ::top(&this->stack);
    if ((pvVar2->second & 1U) != 0) {
      statement_inner<char_const(&)[3]>(this,(char (*) [3])",\n");
    }
  }
  statement<char_const(&)[2]>(this,(char (*) [2])0x5978ea);
  this->indent = this->indent + 1;
  local_14 = Array;
  local_15 = false;
  std::
  stack<std::pair<simple_json::Type,bool>,std::deque<std::pair<simple_json::Type,bool>,std::allocator<std::pair<simple_json::Type,bool>>>>
  ::emplace<simple_json::Type,bool>
            ((stack<std::pair<simple_json::Type,bool>,std::deque<std::pair<simple_json::Type,bool>,std::allocator<std::pair<simple_json::Type,bool>>>>
              *)this,&local_14,&local_15);
  return;
}

Assistant:

void Stream::begin_json_array()
{
	if (!stack.empty() && stack.top().second)
	{
		statement_inner(",\n");
	}
	statement("[");
	++indent;
	stack.emplace(Type::Array, false);
}